

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

bool __thiscall
ON_PolyEdgeSegment::Create(ON_PolyEdgeSegment *this,ON_Curve *curve,ON_UUID *object_id)

{
  double t0;
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  ON_BrepEdge *this_00;
  ON_Brep *pOVar5;
  ON_Curve *real_curve;
  ON_COMPONENT_INDEX OVar6;
  double *pdVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  ON_Interval real_curve_subdomain;
  int extraout_var;
  
  Init(this);
  if (curve == (ON_Curve *)0x0) {
    return false;
  }
  this_00 = ON_BrepEdge::Cast((ON_Object *)curve);
  if (this_00 == (ON_BrepEdge *)0x0) {
    ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,curve);
  }
  else {
    pOVar5 = ON_BrepEdge::Brep(this_00);
    if (pOVar5 == (ON_Brep *)0x0) {
      return false;
    }
    real_curve = ON_BrepEdge::EdgeCurveOf(this_00);
    if (real_curve == (ON_Curve *)0x0) {
      return false;
    }
    this->m_edge = this_00;
    this->m_brep = pOVar5;
    OVar6.m_type = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object
                     ._vptr_ON_Object[0x22])(this_00);
    OVar6.m_index = extraout_var;
    this->m_component_index = OVar6;
    (*(this->m_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    (this->m_edge_domain).m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (this->m_edge_domain).m_t[1] = in_XMM1_Qa;
    (*(this->m_trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    (this->m_trim_domain).m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    (this->m_trim_domain).m_t[1] = in_XMM1_Qa;
    real_curve_subdomain = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
    ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,real_curve,real_curve_subdomain);
    bVar4 = ON_CurveProxy::ProxyCurveIsReversed(&this->m_edge->super_ON_CurveProxy);
    if (bVar4) {
      ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
    }
    pdVar7 = ON_Interval::operator[](&this->m_edge_domain,0);
    t0 = *pdVar7;
    pdVar7 = ON_Interval::operator[](&this->m_edge_domain,1);
    ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,t0,*pdVar7);
  }
  uVar2 = object_id->Data2;
  uVar3 = object_id->Data3;
  uVar1 = *(undefined8 *)object_id->Data4;
  (this->m_object_id).Data1 = object_id->Data1;
  (this->m_object_id).Data2 = uVar2;
  (this->m_object_id).Data3 = uVar3;
  *(undefined8 *)(this->m_object_id).Data4 = uVar1;
  return true;
}

Assistant:

bool ON_PolyEdgeSegment::Create( 
          const ON_Curve* curve,
          const ON_UUID& object_id 
          )
{
  //bool rc = false;
  Init();
  if ( !curve )
    return false;
  const ON_BrepEdge* edge = ON_BrepEdge::Cast(curve);
  if ( edge )
  {
    const ON_Brep* brep = edge->Brep();
    if ( !brep )
      return false;
    const ON_Curve* c3 = edge->EdgeCurveOf();
    if ( !c3 )
      return false;
    m_edge = edge;
    m_brep = brep;
    m_component_index = edge->ComponentIndex();
    m_edge_domain = m_edge->Domain();
    m_trim_domain = m_trim->Domain();
    ON_CurveProxy::SetProxyCurve( 
                      c3,
                      edge->ProxyCurveDomain()
                      );    
    if ( m_edge->ProxyCurveIsReversed() )
      ON_CurveProxy::Reverse();
    ON_CurveProxy::SetDomain( m_edge_domain[0], m_edge_domain[1] );
  }
  else
  {
    ON_CurveProxy::SetProxyCurve(const_cast<ON_Curve*>(curve));   
  }
  m_object_id = object_id;
  return true;
}